

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O0

void bsdcat_read_to_stdout(char *filename)

{
  wchar_t wVar1;
  int iVar2;
  archive_entry **in_RDI;
  char *in_stack_00000008;
  archive *in_stack_00000010;
  int in_stack_00000104;
  archive *in_stack_00000108;
  
  wVar1 = archive_read_open_filename(in_stack_00000010,in_stack_00000008,(size_t)filename);
  if (wVar1 == L'\0') {
    iVar2 = archive_read_next_header((archive *)filename,in_RDI);
    if (iVar2 == 0) {
      iVar2 = archive_read_data_into_fd(in_stack_00000108,in_stack_00000104);
      if (iVar2 == 0) goto LAB_00106652;
    }
  }
  bsdcat_print_error();
LAB_00106652:
  iVar2 = archive_read_free((archive *)0x10665e);
  if (iVar2 != 0) {
    bsdcat_print_error();
  }
  return;
}

Assistant:

void
bsdcat_read_to_stdout(char* filename)
{
	if ((archive_read_open_filename(a, filename, BYTES_PER_BLOCK) != ARCHIVE_OK)
	    || (archive_read_next_header(a, &ae) != ARCHIVE_OK)
	    || (archive_read_data_into_fd(a, 1) != ARCHIVE_OK))
		bsdcat_print_error();
	if (archive_read_free(a) != ARCHIVE_OK)
		bsdcat_print_error();
}